

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_sa_system.hpp
# Opt level: O1

void __thiscall
openjij::system::
SASystem<openjij::graph::BinaryPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>_>
::Flip(SASystem<openjij::graph::BinaryPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>_>
       *this,int32_t index)

{
  double dVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  pointer pvVar6;
  pointer puVar7;
  pointer ppVar8;
  pointer piVar9;
  unsigned_long uVar10;
  int *piVar11;
  pointer pdVar12;
  const_iterator __begin4;
  pointer puVar13;
  const_iterator __end4;
  int *v_index;
  int *piVar14;
  
  pcVar5 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar2 = pcVar5[index];
  pcVar5[index] = '\x01' - cVar2;
  pvVar6 = (this->adjacency_list_->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar13 = pvVar6[index].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar7 = *(pointer *)
            ((long)&pvVar6[index].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (cVar2 == '\0') {
    if (puVar13 != puVar7) {
      pcVar5 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
               .super__Vector_impl_data._M_start;
      ppVar8 = (this->key_value_list_->
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar9 = (this->zero_count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar10 = *puVar13;
        dVar1 = ppVar8[uVar10].second;
        iVar3 = piVar9[uVar10];
        piVar9[uVar10] = iVar3 + -1;
        piVar14 = *(int **)&ppVar8[uVar10].first.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl;
        piVar11 = *(pointer *)
                   ((long)&ppVar8[uVar10].first.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl + 8);
        if (piVar14 != piVar11) {
          pdVar12 = (this->base_energy_difference_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar4 = *piVar14;
            if ((iVar4 != index) && (pcVar5[iVar4] + iVar3 == 2)) {
              pdVar12[iVar4] = pdVar12[iVar4] + dVar1;
            }
            piVar14 = piVar14 + 1;
          } while (piVar14 != piVar11);
        }
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar7);
    }
  }
  else if (puVar13 != puVar7) {
    pcVar5 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar8 = (this->key_value_list_->
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar9 = (this->zero_count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar10 = *puVar13;
      dVar1 = ppVar8[uVar10].second;
      iVar3 = piVar9[uVar10];
      piVar9[uVar10] = iVar3 + 1;
      piVar14 = *(int **)&ppVar8[uVar10].first.super__Vector_base<int,_std::allocator<int>_>._M_impl
      ;
      piVar11 = *(pointer *)
                 ((long)&ppVar8[uVar10].first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 + 8);
      if (piVar14 != piVar11) {
        pdVar12 = (this->base_energy_difference_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar4 = *piVar14;
          if ((iVar4 != index) && (pcVar5[iVar4] + iVar3 == 1)) {
            pdVar12[iVar4] = pdVar12[iVar4] - dVar1;
          }
          piVar14 = piVar14 + 1;
        } while (piVar14 != piVar11);
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar7);
  }
  return;
}

Assistant:

void Flip(const std::int32_t index) {
      const VariableType state = sample_[index];
      sample_[index] = 1 - sample_[index];
      if (state == 0) {
         for (const auto &index_key: adjacency_list_[index]) {
            const ValueType val = key_value_list_[index_key].second;
            const std::int32_t total_zero_count = zero_count_[index_key];
            zero_count_[index_key] -= 1;
            for (const auto &v_index: key_value_list_[index_key].first) {
               if (total_zero_count + sample_[v_index] == 2 && v_index != index) {
                  base_energy_difference_[v_index] += val;
               }
            }
         }
      }
      else { //state == 1
         for (const auto &index_key: adjacency_list_[index]) {
            const ValueType val = key_value_list_[index_key].second;
            const std::int32_t total_zero_count = zero_count_[index_key];
            zero_count_[index_key] += 1;
            for (const auto &v_index: key_value_list_[index_key].first) {
               if (total_zero_count + sample_[v_index] == 1 && v_index != index) {
                  base_energy_difference_[v_index] -= val;
               }
            }
         }
      }
   }